

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O0

uint32_t __thiscall cppcms::impl::cgi::fastcgi::read_len(fastcgi *this,uchar **p,uchar *e)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  uint32_t len;
  uint32_t B0;
  uint32_t B1;
  uint32_t B2;
  uint32_t B3;
  uchar *e_local;
  uchar **p_local;
  fastcgi *this_local;
  uint local_4;
  
  if ((*p < e) && (**p < 0x80)) {
    pbVar4 = *p;
    *p = pbVar4 + 1;
    local_4 = (uint)*pbVar4;
  }
  else if ((long)e - (long)*p < 4) {
    local_4 = 0xffffffff;
  }
  else {
    pbVar4 = *p;
    *p = pbVar4 + 1;
    bVar1 = *pbVar4;
    pbVar4 = *p;
    *p = pbVar4 + 1;
    bVar2 = *pbVar4;
    pbVar4 = *p;
    *p = pbVar4 + 1;
    bVar3 = *pbVar4;
    pbVar4 = *p;
    *p = pbVar4 + 1;
    local_4 = (bVar1 & 0x7f) * 0x1000000 + (uint)bVar2 * 0x10000 + (uint)bVar3 * 0x100 +
              (uint)*pbVar4;
  }
  return local_4;
}

Assistant:

uint32_t read_len(unsigned char const *&p,unsigned char const *e)
		{
			if (p<e && *p < 0x80) {
				return *p++;
			}
			else if(e-p >= 4) {
				uint32_t B3=*p++;
				uint32_t B2=*p++;
				uint32_t B1=*p++;
				uint32_t B0=*p++;
				uint32_t len = ((B3 & 0x7fU) << 24) + (B2 << 16) + (B1 << 8) + B0;
				return len;
			}
			else {
				return 0xFFFFFFFFu;
			}
		}